

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O0

Value * __thiscall
camp::Property::get(Value *__return_storage_ptr__,Property *this,UserObject *object)

{
  bool bVar1;
  ForbiddenRead *__return_storage_ptr___00;
  string *propertyName;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [48];
  ForbiddenRead local_68;
  UserObject *local_20;
  UserObject *object_local;
  Property *this_local;
  
  local_20 = object;
  object_local = (UserObject *)this;
  this_local = (Property *)__return_storage_ptr__;
  bVar1 = readable(this,object);
  if (!bVar1) {
    __return_storage_ptr___00 = (ForbiddenRead *)__cxa_allocate_exception(0x48);
    propertyName = name_abi_cxx11_(this);
    ForbiddenRead::ForbiddenRead(&local_68,propertyName);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/property.cpp"
               ,&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c0,"Value camp::Property::get(const UserObject &) const",&local_c1);
    Error::prepare<camp::ForbiddenRead>
              (__return_storage_ptr___00,&local_68,(string *)local_98,0x49,(string *)local_c0);
    __cxa_throw(__return_storage_ptr___00,&ForbiddenRead::typeinfo,ForbiddenRead::~ForbiddenRead);
  }
  (*(this->super_TagHolder)._vptr_TagHolder[3])(__return_storage_ptr__,this,local_20);
  return __return_storage_ptr__;
}

Assistant:

Value Property::get(const UserObject& object) const
{
    // Check if the property is readable
    if (!readable(object))
        CAMP_ERROR(ForbiddenRead(name()));

    return getValue(object);
}